

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O0

void __thiscall
gl4cts::DirectStateAccess::Textures::SubImageErrorsTest::Clean(SubImageErrorsTest *this)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  Functions *gl;
  SubImageErrorsTest *this_local;
  long lVar3;
  
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  if (this->m_to_1D_empty != 0) {
    (**(code **)(lVar3 + 0x480))(1,&this->m_to_1D_empty);
    this->m_to_1D_empty = 0;
  }
  if (this->m_to_2D_empty != 0) {
    (**(code **)(lVar3 + 0x480))(1,&this->m_to_2D_empty);
    this->m_to_2D_empty = 0;
  }
  if (this->m_to_3D_empty != 0) {
    (**(code **)(lVar3 + 0x480))(1,&this->m_to_3D_empty);
    this->m_to_3D_empty = 0;
  }
  if (this->m_to_1D != 0) {
    (**(code **)(lVar3 + 0x480))(1,&this->m_to_1D);
    this->m_to_1D = 0;
  }
  if (this->m_to_2D != 0) {
    (**(code **)(lVar3 + 0x480))(1,&this->m_to_2D);
    this->m_to_2D = 0;
  }
  if (this->m_to_3D != 0) {
    (**(code **)(lVar3 + 0x480))(1,&this->m_to_3D);
    this->m_to_3D = 0;
  }
  if (this->m_to_1D_compressed != 0) {
    (**(code **)(lVar3 + 0x480))(1,&this->m_to_1D_compressed);
    this->m_to_1D_compressed = 0;
  }
  if (this->m_to_2D_compressed != 0) {
    (**(code **)(lVar3 + 0x480))(1,&this->m_to_2D_compressed);
    this->m_to_2D_compressed = 0;
  }
  if (this->m_to_3D_compressed != 0) {
    (**(code **)(lVar3 + 0x480))(1,&this->m_to_3D_compressed);
    this->m_to_3D_compressed = 0;
  }
  if (this->m_to_rectangle_compressed != 0) {
    (**(code **)(lVar3 + 0x480))(1,&this->m_to_rectangle_compressed);
    this->m_to_rectangle_compressed = 0;
  }
  if (this->m_bo != 0) {
    (**(code **)(lVar3 + 0x438))(1,&this->m_bo);
    this->m_bo = 0;
  }
  this->m_to_invalid = 0;
  this->m_format_invalid = 0;
  this->m_type_invalid = 0;
  this->m_max_texture_size = 1;
  if (this->m_reference_compressed_1D != (GLubyte *)0x0) {
    if (this->m_reference_compressed_1D != (GLubyte *)0x0) {
      operator_delete__(this->m_reference_compressed_1D);
    }
    this->m_reference_compressed_1D = (GLubyte *)0x0;
  }
  if (this->m_reference_compressed_2D != (GLubyte *)0x0) {
    if (this->m_reference_compressed_2D != (GLubyte *)0x0) {
      operator_delete__(this->m_reference_compressed_2D);
    }
    this->m_reference_compressed_2D = (GLubyte *)0x0;
  }
  if (this->m_reference_compressed_3D != (GLubyte *)0x0) {
    if (this->m_reference_compressed_3D != (GLubyte *)0x0) {
      operator_delete__(this->m_reference_compressed_3D);
    }
    this->m_reference_compressed_3D = (GLubyte *)0x0;
  }
  if (this->m_reference_compressed_rectangle != (GLubyte *)0x0) {
    if (this->m_reference_compressed_rectangle != (GLubyte *)0x0) {
      operator_delete__(this->m_reference_compressed_rectangle);
    }
    this->m_reference_compressed_rectangle = (GLubyte *)0x0;
  }
  this->m_reference_compressed_1D_format = 0;
  this->m_reference_compressed_2D_format = 0;
  this->m_reference_compressed_3D_format = 0;
  this->m_reference_compressed_rectangle_format = 0;
  this->m_reference_compressed_1D_size = 0;
  this->m_reference_compressed_2D_size = 0;
  this->m_reference_compressed_3D_size = 0;
  this->m_reference_compressed_rectangle_size = 0;
  this->m_format_compressed_not_matching = 0;
  do {
    iVar1 = (**(code **)(lVar3 + 0x800))();
  } while (iVar1 != 0);
  return;
}

Assistant:

void SubImageErrorsTest::Clean()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Cleanup. */
	if (m_to_1D_empty)
	{
		gl.deleteTextures(1, &m_to_1D_empty);

		m_to_1D_empty = 0;
	}

	if (m_to_2D_empty)
	{
		gl.deleteTextures(1, &m_to_2D_empty);

		m_to_2D_empty = 0;
	}

	if (m_to_3D_empty)
	{
		gl.deleteTextures(1, &m_to_3D_empty);

		m_to_3D_empty = 0;
	}

	if (m_to_1D)
	{
		gl.deleteTextures(1, &m_to_1D);

		m_to_1D = 0;
	}

	if (m_to_2D)
	{
		gl.deleteTextures(1, &m_to_2D);

		m_to_2D = 0;
	}

	if (m_to_3D)
	{
		gl.deleteTextures(1, &m_to_3D);

		m_to_3D = 0;
	}

	if (m_to_1D_compressed)
	{
		gl.deleteTextures(1, &m_to_1D_compressed);

		m_to_1D_compressed = 0;
	}

	if (m_to_2D_compressed)
	{
		gl.deleteTextures(1, &m_to_2D_compressed);

		m_to_2D_compressed = 0;
	}

	if (m_to_3D_compressed)
	{
		gl.deleteTextures(1, &m_to_3D_compressed);

		m_to_3D_compressed = 0;
	}

	if (m_to_rectangle_compressed)
	{
		gl.deleteTextures(1, &m_to_rectangle_compressed);

		m_to_rectangle_compressed = 0;
	}

	if (m_bo)
	{
		gl.deleteBuffers(1, &m_bo);

		m_bo = 0;
	}

	m_to_invalid	   = 0;
	m_format_invalid   = 0;
	m_type_invalid	 = 0;
	m_max_texture_size = 1;

	if (DE_NULL != m_reference_compressed_1D)
	{
		delete[] m_reference_compressed_1D;

		m_reference_compressed_1D = NULL;
	}

	if (DE_NULL != m_reference_compressed_2D)
	{
		delete[] m_reference_compressed_2D;

		m_reference_compressed_2D = NULL;
	}

	if (DE_NULL != m_reference_compressed_3D)
	{
		delete[] m_reference_compressed_3D;

		m_reference_compressed_3D = NULL;
	}

	if (DE_NULL != m_reference_compressed_rectangle)
	{
		delete[] m_reference_compressed_rectangle;

		m_reference_compressed_rectangle = NULL;
	}

	m_reference_compressed_1D_format		= 0;
	m_reference_compressed_2D_format		= 0;
	m_reference_compressed_3D_format		= 0;
	m_reference_compressed_rectangle_format = 0;
	m_reference_compressed_1D_size			= 0;
	m_reference_compressed_2D_size			= 0;
	m_reference_compressed_3D_size			= 0;
	m_reference_compressed_rectangle_size   = 0;
	m_format_compressed_not_matching		= 0;

	while (GL_NO_ERROR != gl.getError())
		;
}